

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.h
# Opt level: O2

void run_container_append_value(run_container_t *run,uint16_t val,rle16_t *previousrl)

{
  uint uVar1;
  undefined2 in_register_00000032;
  
  uVar1 = (uint)previousrl->value + (uint)previousrl->length + 1;
  if (uVar1 < CONCAT22(in_register_00000032,val)) {
    previousrl->value = val;
    previousrl->length = 0;
    run->runs[run->n_runs] = *previousrl;
    run->n_runs = run->n_runs + 1;
    return;
  }
  if (uVar1 == CONCAT22(in_register_00000032,val)) {
    previousrl->length = previousrl->length + 1;
    run->runs[(long)run->n_runs + -1] = *previousrl;
  }
  return;
}

Assistant:

static inline void run_container_append_value(run_container_t *run,
                                              uint16_t val,
                                              rle16_t *previousrl) {
    const uint32_t previousend = previousrl->value + previousrl->length;
    if (val > previousend + 1) {  // we add a new one
        *previousrl = CROARING_MAKE_RLE16(val, 0);
        run->runs[run->n_runs] = *previousrl;
        run->n_runs++;
    } else if (val == previousend + 1) {  // we merge
        previousrl->length++;
        run->runs[run->n_runs - 1] = *previousrl;
    }
}